

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O1

bool llvm::DWARFFormValue::skipValue
               (Form Form,DataExtractor DebugInfoData,uint64_t *OffsetPtr,FormParams Params)

{
  uint uVar1;
  byte bVar2;
  Optional<unsigned_char> OVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  
  uVar6 = (uint64_t)Form;
LAB_00d8b02e:
  uVar1 = (uint)uVar6 & 0xffff;
  switch(uVar1) {
  case 2:
  case 0x21:
  case 0x27:
  case 0x2b:
    return false;
  case 3:
    uVar4 = DataExtractor::getU16(&DebugInfoData,OffsetPtr,(Error *)0x0);
    uVar6 = (uint64_t)uVar4;
    break;
  case 4:
    uVar5 = DataExtractor::getU32(&DebugInfoData,OffsetPtr,(Error *)0x0);
    uVar6 = (uint64_t)uVar5;
    break;
  case 8:
    DataExtractor::getCStr(&DebugInfoData,OffsetPtr);
    return true;
  case 9:
  case 0x18:
    uVar6 = DataExtractor::getULEB128(&DebugInfoData,OffsetPtr,(Error *)0x0);
    break;
  case 10:
    bVar2 = DataExtractor::getU8(&DebugInfoData,OffsetPtr,(Error *)0x0);
    uVar6 = (uint64_t)bVar2;
    break;
  case 0xd:
    DataExtractor::getSLEB128(&DebugInfoData,OffsetPtr);
    return true;
  case 0xf:
  case 0x15:
  case 0x1a:
  case 0x1b:
  case 0x22:
  case 0x23:
    goto switchD_00d8b040_caseD_f;
  case 0x16:
    goto switchD_00d8b040_caseD_16;
  default:
    if (uVar1 - 0x1f01 < 2) {
switchD_00d8b040_caseD_f:
      DataExtractor::getULEB128(&DebugInfoData,OffsetPtr,(Error *)0x0);
      return true;
    }
    if (1 < uVar1 - 0x1f20) {
      return false;
    }
  case 1:
  case 5:
  case 6:
  case 7:
  case 0xb:
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x17:
  case 0x19:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2c:
    OVar3 = dwarf::getFixedFormByteSize((Form)uVar6,Params);
    if (((ushort)OVar3.Storage & 0x100) != 0) {
      *OffsetPtr = *OffsetPtr + (ulong)((ushort)OVar3.Storage & 0xff);
    }
    return (bool)(OVar3.Storage.hasVal & 1);
  }
  *OffsetPtr = *OffsetPtr + uVar6;
  return true;
switchD_00d8b040_caseD_16:
  uVar6 = DataExtractor::getULEB128(&DebugInfoData,OffsetPtr,(Error *)0x0);
  goto LAB_00d8b02e;
}

Assistant:

bool DWARFFormValue::skipValue(dwarf::Form Form, DataExtractor DebugInfoData,
                               uint64_t *OffsetPtr,
                               const dwarf::FormParams Params) {
  bool Indirect = false;
  do {
    switch (Form) {
    // Blocks of inlined data that have a length field and the data bytes
    // inlined in the .debug_info.
    case DW_FORM_exprloc:
    case DW_FORM_block: {
      uint64_t size = DebugInfoData.getULEB128(OffsetPtr);
      *OffsetPtr += size;
      return true;
    }
    case DW_FORM_block1: {
      uint8_t size = DebugInfoData.getU8(OffsetPtr);
      *OffsetPtr += size;
      return true;
    }
    case DW_FORM_block2: {
      uint16_t size = DebugInfoData.getU16(OffsetPtr);
      *OffsetPtr += size;
      return true;
    }
    case DW_FORM_block4: {
      uint32_t size = DebugInfoData.getU32(OffsetPtr);
      *OffsetPtr += size;
      return true;
    }

    // Inlined NULL terminated C-strings.
    case DW_FORM_string:
      DebugInfoData.getCStr(OffsetPtr);
      return true;

    case DW_FORM_addr:
    case DW_FORM_ref_addr:
    case DW_FORM_flag_present:
    case DW_FORM_data1:
    case DW_FORM_data2:
    case DW_FORM_data4:
    case DW_FORM_data8:
    case DW_FORM_data16:
    case DW_FORM_flag:
    case DW_FORM_ref1:
    case DW_FORM_ref2:
    case DW_FORM_ref4:
    case DW_FORM_ref8:
    case DW_FORM_ref_sig8:
    case DW_FORM_ref_sup4:
    case DW_FORM_ref_sup8:
    case DW_FORM_strx1:
    case DW_FORM_strx2:
    case DW_FORM_strx4:
    case DW_FORM_addrx1:
    case DW_FORM_addrx2:
    case DW_FORM_addrx4:
    case DW_FORM_sec_offset:
    case DW_FORM_strp:
    case DW_FORM_strp_sup:
    case DW_FORM_line_strp:
    case DW_FORM_GNU_ref_alt:
    case DW_FORM_GNU_strp_alt:
      if (Optional<uint8_t> FixedSize =
              dwarf::getFixedFormByteSize(Form, Params)) {
        *OffsetPtr += *FixedSize;
        return true;
      }
      return false;

    // signed or unsigned LEB 128 values.
    case DW_FORM_sdata:
      DebugInfoData.getSLEB128(OffsetPtr);
      return true;

    case DW_FORM_udata:
    case DW_FORM_ref_udata:
    case DW_FORM_strx:
    case DW_FORM_addrx:
    case DW_FORM_loclistx:
    case DW_FORM_rnglistx:
    case DW_FORM_GNU_addr_index:
    case DW_FORM_GNU_str_index:
      DebugInfoData.getULEB128(OffsetPtr);
      return true;

    case DW_FORM_indirect:
      Indirect = true;
      Form = static_cast<dwarf::Form>(DebugInfoData.getULEB128(OffsetPtr));
      break;

    default:
      return false;
    }
  } while (Indirect);
  return true;
}